

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::Conv1DWide::backward_impl
          (Conv1DWide *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  float fVar2;
  pointer ppTVar3;
  Tensor *pTVar4;
  Tensor *pTVar5;
  Scalar *pSVar6;
  ulong uVar7;
  uint k;
  ulong uVar8;
  ulong uVar9;
  uint j;
  ulong uVar10;
  uint i_1;
  ulong uVar11;
  ulong uVar12;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  
  if (i < 2) {
    ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = *ppTVar3;
    pTVar5 = ppTVar3[1];
    uVar12 = 1;
    uVar9 = 1;
    if (1 < (pTVar4->d).nd) {
      uVar9 = (ulong)(pTVar4->d).d[1];
    }
    uVar7 = (ulong)(pTVar4->d).d[0];
    if (1 < (pTVar5->d).nd) {
      uVar12 = (ulong)(pTVar5->d).d[1];
    }
    Tensor::operator*(&d,dEdf);
    Tensor::operator*(&di,dEdxi);
    if (i == 0) {
      Tensor::operator*(&x,(xs->
                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]);
      for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&x,uVar11,uVar8);
            fVar1 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&d,uVar11,(ulong)(uint)((int)uVar10 + (int)uVar8));
            fVar2 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&di,uVar11,uVar10);
            *pSVar6 = fVar1 * fVar2 + *pSVar6;
          }
        }
      }
    }
    else {
      Tensor::operator*(&x,*(xs->
                            super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start);
      for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 *)&x,uVar11,uVar10);
          fVar1 = *pSVar6;
          for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&d,uVar11,(ulong)(uint)((int)uVar10 + (int)uVar8));
            fVar2 = *pSVar6;
            pSVar6 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&di,uVar11,uVar8);
            *pSVar6 = fVar2 * fVar1 + *pSVar6;
          }
        }
      }
    }
    return;
  }
  __assert_fail("i < 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/conv.cc"
                ,0xe9,
                "virtual void cnn::Conv1DWide::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Conv1DWide::backward_impl(const vector<const Tensor*>& xs,
                          const Tensor& fx,
                          const Tensor& dEdf,
                          unsigned i,
                          Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DWide::backward not implemented for CUDA");
#else
  assert(i < 2);
  const unsigned rows = xs[0]->d.rows();
  const unsigned xcols = xs[0]->d.cols();
  const unsigned fcols = xs[1]->d.cols();
  auto d = *dEdf;
  auto di = *dEdxi;
  if (i == 0) { // derivative wrt input x
    auto f = **xs[1];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, j) += f(i, k) * d(i, j + k);
      }
    }
  } else { // derivative wrt filter f
    auto x = **xs[0];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        const float xij = x(i, j);
        for (unsigned k = 0; k < fcols; ++k)
          di(i, k) += xij * d(i, j + k);
      }
    }
  }
#endif
}